

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  lVar1 = t->u;
  lVar2 = t->v;
  lVar3 = t->q;
  lVar4 = t->r;
  lVar5 = f->v[0];
  lVar6 = g->v[0];
  lVar8 = SUB168(SEXT816(lVar6) * SEXT816(lVar2),8) + SUB168(SEXT816(lVar5) * SEXT816(lVar1),8) +
          (ulong)CARRY8(lVar6 * lVar2,lVar5 * lVar1);
  lVar11 = SUB168(SEXT816(lVar6) * SEXT816(lVar4),8) + SUB168(SEXT816(lVar5) * SEXT816(lVar3),8) +
           (ulong)CARRY8(lVar6 * lVar4,lVar5 * lVar3);
  uVar10 = (ulong)(lVar6 * lVar4 + lVar5 * lVar3) >> 0x3e | lVar11 * 4;
  uVar9 = (ulong)(lVar6 * lVar2 + lVar5 * lVar1) >> 0x3e | lVar8 * 4;
  if (1 < len) {
    uVar7 = 1;
    do {
      lVar5 = f->v[uVar7];
      lVar6 = g->v[uVar7];
      uVar12 = lVar5 * lVar1 + uVar9;
      uVar13 = lVar6 * lVar2 + uVar12;
      lVar8 = SUB168(SEXT816(lVar6) * SEXT816(lVar2),8) +
              SUB168(SEXT816(lVar5) * SEXT816(lVar1),8) + (lVar8 >> 0x3e) +
              (ulong)CARRY8(lVar5 * lVar1,uVar9) + (ulong)CARRY8(lVar6 * lVar2,uVar12);
      uVar9 = lVar5 * lVar3 + uVar10;
      uVar12 = lVar6 * lVar4 + uVar9;
      lVar11 = SUB168(SEXT816(lVar6) * SEXT816(lVar4),8) +
               SUB168(SEXT816(lVar5) * SEXT816(lVar3),8) + (lVar11 >> 0x3e) +
               (ulong)CARRY8(lVar5 * lVar3,uVar10) + (ulong)CARRY8(lVar6 * lVar4,uVar9);
      uVar9 = lVar8 * 4 | uVar13 >> 0x3e;
      f->v[uVar7 - 1] = uVar13 & 0x3fffffffffffffff;
      uVar10 = lVar11 * 4 | uVar12 >> 0x3e;
      g->v[uVar7 - 1] = uVar12 & 0x3fffffffffffffff;
      uVar7 = uVar7 + 1;
    } while ((uint)len != uVar7);
  }
  f->v[(long)len + -1] = uVar9;
  g->v[(long)len + -1] = uVar10;
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}